

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1c0a25::CommandTask::inputsAvailable(CommandTask *this,TaskInterface ti)

{
  int iVar1;
  anon_class_24_2_e88081f0 fn;
  DetachedContext ctx;
  TaskInterface local_58;
  anon_class_24_2_e88081f0 local_48;
  QueueJob local_30;
  
  local_58.ctx = ti.ctx;
  local_58.impl = ti.impl;
  local_48.this = this;
  local_48.ti.impl = local_58.impl;
  local_48.ti.ctx = local_58.ctx;
  iVar1 = (*(this->command->super_JobDescriptor)._vptr_JobDescriptor[0x13])();
  if ((char)iVar1 == '\0') {
    local_30.desc = &this->command->super_JobDescriptor;
    local_30.work.super__Function_base._M_functor._8_8_ = 0;
    local_30.work.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
    *(CommandTask **)local_30.work.super__Function_base._M_functor._M_unused._0_8_ = local_48.this;
    *(void **)((long)local_30.work.super__Function_base._M_functor._M_unused._0_8_ + 8) =
         local_48.ti.impl;
    *(void **)((long)local_30.work.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         local_48.ti.ctx;
    local_30.work._M_invoker =
         std::
         _Function_handler<void_(llbuild::basic::QueueJobContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1561:15)>
         ::_M_invoke;
    local_30.work.super__Function_base._M_manager =
         std::
         _Function_handler<void_(llbuild::basic::QueueJobContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1561:15)>
         ::_M_manager;
    llbuild::core::TaskInterface::spawn(&local_58,&local_30,Normal);
    if (local_30.work.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_30.work.super__Function_base._M_manager)
                ((_Any_data *)&local_30.work,(_Any_data *)&local_30.work,__destroy_functor);
    }
  }
  else {
    local_30.desc = (JobDescriptor *)&PTR__QueueJobContext_00250170;
    inputsAvailable::anon_class_24_2_e88081f0::operator()(&local_48,(QueueJobContext *)&local_30);
    llbuild::basic::QueueJobContext::~QueueJobContext((QueueJobContext *)&local_30);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    auto fn = [this, ti](QueueJobContext* context) mutable {
      // If the build should cancel, do nothing.
      if (ti.isCancelled()) {
        ti.complete(BuildValue::makeCancelledCommand().toData());
        return;
      }

      // Check if the command should be skipped.
      if (!getBuildSystem(ti).getDelegate().shouldCommandStart(&command)) {
        // We need to call commandFinished here because commandPreparing and
        // shouldCommandStart guarantee that they're followed by
        // commandFinished.
        getBuildSystem(ti).getDelegate().commandFinished(&command, ProcessStatus::Skipped);
        ti.complete(BuildValue::makeSkippedCommand().toData());
        return;
      }
    
      // Execute the command, with notifications to the delegate.
      command.execute(getBuildSystem(ti).getBuildSystem(), ti, context, [ti](BuildValue&& result) mutable {
        // Inform the engine of the result.
        if (result.isFailedCommand()) {
          getBuildSystem(ti).getDelegate().hadCommandFailure();
        }
        ti.complete(result.toData());
      });
    };
    if (command.isDetached()) {
      struct DetachedContext: public QueueJobContext {
        unsigned laneID() const override { return -1; }
      };
      DetachedContext ctx;
      fn(&ctx);
    } else {
      ti.spawn({ &command, std::move(fn) });
    }
  }